

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontAtlas::GetTexDataAsRGBA32
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  uchar *puVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uchar *pixels;
  uchar *local_38;
  
  puVar2 = this->TexPixelsRGBA32;
  if (puVar2 == (uint *)0x0) {
    local_38 = (uchar *)0x0;
    GetTexDataAsAlpha8(this,&local_38,(int *)0x0,(int *)0x0,(int *)0x0);
    puVar1 = local_38;
    if (local_38 == (uchar *)0x0) {
      puVar2 = this->TexPixelsRGBA32;
    }
    else {
      puVar2 = (uint *)ImGui::MemAlloc((long)this->TexHeight * (long)this->TexWidth * 4);
      this->TexPixelsRGBA32 = puVar2;
      iVar3 = this->TexHeight * this->TexWidth;
      if (0 < iVar3) {
        uVar4 = iVar3 + 1;
        lVar5 = 0;
        do {
          puVar2[lVar5] = (uint)puVar1[lVar5] << 0x18 | 0xffffff;
          uVar4 = uVar4 - 1;
          lVar5 = lVar5 + 1;
        } while (1 < uVar4);
      }
    }
  }
  *out_pixels = (uchar *)puVar2;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 4;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsRGBA32(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Convert to RGBA32 format on demand
    // Although it is likely to be the most commonly used format, our font rendering is 1 channel / 8 bpp
    if (!TexPixelsRGBA32)
    {
        unsigned char* pixels = NULL;
        GetTexDataAsAlpha8(&pixels, NULL, NULL);
        if (pixels)
        {
            TexPixelsRGBA32 = (unsigned int*)ImGui::MemAlloc((size_t)TexWidth * (size_t)TexHeight * 4);
            const unsigned char* src = pixels;
            unsigned int* dst = TexPixelsRGBA32;
            for (int n = TexWidth * TexHeight; n > 0; n--)
                *dst++ = IM_COL32(255, 255, 255, (unsigned int)(*src++));
        }
    }

    *out_pixels = (unsigned char*)TexPixelsRGBA32;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 4;
}